

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialShellANCF::Calc_E_eps
          (ChMaterialShellANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  dVar1 = nu->m_data[0];
  dVar2 = E->m_data[0];
  dVar3 = nu->m_data[1];
  dVar4 = nu->m_data[2];
  dVar5 = E->m_data[2];
  dVar1 = (((1.0 - (dVar1 * dVar1 * E->m_data[1]) / dVar2) - (dVar3 * dVar3 * dVar5) / dVar2) -
          (dVar5 * dVar4 * dVar4) / E->m_data[1]) -
          (dVar5 * dVar4 * (dVar1 + dVar1) * dVar3) / dVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> *)&this->m_E_eps);
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = ((1.0 - (nu->m_data[2] * nu->m_data[2] * E->m_data[2]) / E->m_data[1]) * E->m_data[0])
             / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = ((1.0 - (nu->m_data[1] * nu->m_data[1] * E->m_data[2]) / E->m_data[0]) * E->m_data[1])
             / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = ((1.0 - (nu->m_data[0] * nu->m_data[0] * E->m_data[1]) / E->m_data[0]) *
                E->m_data[2]) / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[1] = (E->m_data[1] *
             ((nu->m_data[1] * nu->m_data[2] * E->m_data[2]) / E->m_data[1] + nu->m_data[0])) /
             dVar1;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = nu->m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = nu->m_data[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = nu->m_data[1];
  auVar6 = vfmadd213sd_fma(auVar10,auVar8,auVar6);
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = (auVar6._0_8_ * E->m_data[2]) / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[6] = (E->m_data[1] *
             ((nu->m_data[1] * nu->m_data[2] * E->m_data[2]) / E->m_data[1] + nu->m_data[0])) /
             dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = (((nu->m_data[1] * nu->m_data[0] * E->m_data[1]) / E->m_data[0] + nu->m_data[2]) *
             E->m_data[2]) / dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = nu->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = nu->m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = nu->m_data[1];
  auVar6 = vfmadd213sd_fma(auVar11,auVar9,auVar7);
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x12] = (auVar6._0_8_ * E->m_data[2]) / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x13] = (((nu->m_data[1] * nu->m_data[0] * E->m_data[1]) / E->m_data[0] + nu->m_data[2]) *
                E->m_data[2]) / dVar1;
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = G->m_data[0];
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = G->m_data[1];
  (this->m_E_eps).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = G->m_data[2];
  return;
}

Assistant:

void ChMaterialShellANCF::Calc_E_eps(const ChVector<>& E, const ChVector<>& nu, const ChVector<>& G) {
    double delta = 1.0 - (nu.x() * nu.x()) * E.y() / E.x() - (nu.y() * nu.y()) * E.z() / E.x() -
                   (nu.z() * nu.z()) * E.z() / E.y() - 2.0 * nu.x() * nu.y() * nu.z() * E.z() / E.x();
    m_E_eps.setZero();
    m_E_eps(0, 0) = E.x() * (1.0 - (nu.z() * nu.z()) * E.z() / E.y()) / delta;
    m_E_eps(1, 1) = E.y() * (1.0 - (nu.y() * nu.y()) * E.z() / E.x()) / delta;
    m_E_eps(3, 3) = E.z() * (1.0 - (nu.x() * nu.x()) * E.y() / E.x()) / delta;
    m_E_eps(0, 1) = E.y() * (nu.x() + nu.y() * nu.z() * E.z() / E.y()) / delta;
    m_E_eps(0, 3) = E.z() * (nu.y() + nu.z() * nu.x()) / delta;
    m_E_eps(1, 0) = E.y() * (nu.x() + nu.y() * nu.z() * E.z() / E.y()) / delta;
    m_E_eps(1, 3) = E.z() * (nu.z() + nu.y() * nu.x() * E.y() / E.x()) / delta;
    m_E_eps(3, 0) = E.z() * (nu.y() + nu.z() * nu.x()) / delta;
    m_E_eps(3, 1) = E.z() * (nu.z() + nu.y() * nu.x() * E.y() / E.x()) / delta;
    m_E_eps(2, 2) = G.x();
    m_E_eps(4, 4) = G.y();
    m_E_eps(5, 5) = G.z();
}